

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidRankInconsistency(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  TypeUnion TVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  ActivationReLU *pAVar11;
  NeuralNetworkLayer *pNVar12;
  LayerUnion LVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  Tensor *pTVar15;
  void *pvVar16;
  ostream *poVar17;
  undefined8 *puVar18;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar19;
  Arena *pAVar20;
  Model m;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018ae55:
    pRVar19 = &(local_80.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018ae55;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar16 + 0x10),"A",puVar18);
  pFVar7 = *(FeatureType **)((long)pvVar16 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar16 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
    pFVar7 = *(FeatureType **)((long)pvVar16 + 0x20);
    if (pFVar7 == (FeatureType *)0x0) {
      pAVar20 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
        pAVar20 = *(Arena **)pAVar20;
      }
      pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                         (pAVar20);
      *(FeatureType **)((long)pvVar16 + 0x20) = pFVar7;
    }
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  this = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  if (uVar2 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
    plVar9 = google::protobuf::RepeatedField<long>::elements(this);
    plVar9[uVar2] = 1;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(this);
    plVar9[uVar2] = 1;
  }
  this->current_size_ = uVar2 + 1;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018afdb:
    pRVar19 = &(local_80.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018afdb;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar16 + 0x10),"C",puVar18);
  pFVar7 = *(FeatureType **)((long)pvVar16 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar16 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar20 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar20);
  }
  TVar5 = local_80.Type_;
  (local_80.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018b0e0:
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar12);
  }
  else {
    iVar1 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018b0e0;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  if (pNVar12->_oneof_case_[0] == 0x82) {
    LVar13 = pNVar12->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x82;
    uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    LVar13.activation_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                   (pAVar20);
    (pNVar12->layer_).activation_ = (ActivationParams *)LVar13;
  }
  if (*(uint32_t *)((long)&(LVar13.convolution_)->kernelsize_ + 0xc) != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(LVar13.activation_);
    *(uint32_t *)((long)&(LVar13.convolution_)->kernelsize_ + 0xc) = 10;
    uVar4 = ((LVar13.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar20);
    ((LVar13.activation_)->NonlinearityType_).relu_ = pAVar11;
  }
  uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
  puVar18 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar12->name_,"relu1",puVar18);
  pRVar3 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018b1ba:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018b1ba;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3975b4);
  pRVar3 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018b20c:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018b20c;
    (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3b5c76);
  pRVar3 = (pNVar12->outputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018b25e:
    pTVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                        ((pNVar12->outputtensor_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->outputtensor_).super_RepeatedPtrFieldBase,pTVar15);
  }
  else {
    iVar1 = (pNVar12->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018b25e;
    (pNVar12->outputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  *(undefined4 *)((long)pvVar16 + 0x24) = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(TVar5.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018b29a:
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar12);
  }
  else {
    iVar1 = (TVar5.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018b29a;
    (TVar5.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  if (pNVar12->_oneof_case_[0] == 0x82) {
    LVar13 = pNVar12->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x82;
    uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    LVar13.activation_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                   (pAVar20);
    (pNVar12->layer_).activation_ = (ActivationParams *)LVar13;
  }
  if (*(int *)((long)&((LVar13.convolution_)->kernelsize_).arena_or_elements_ + 4) != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(LVar13.activation_);
    *(undefined4 *)((long)&((LVar13.convolution_)->kernelsize_).arena_or_elements_ + 4) = 10;
    uVar4 = ((LVar13.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar20);
    ((LVar13.activation_)->NonlinearityType_).relu_ = pAVar11;
  }
  uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
  puVar18 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar12->name_,"relu2",puVar18);
  pRVar3 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018b36d:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018b36d;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3b5c76);
  pRVar3 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0018b3bd:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0018b3bd;
    (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x398ea6);
  pRVar3 = (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar16 = pRVar3->elements[iVar1];
      goto LAB_0018b424;
    }
  }
  pTVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                      ((pNVar12->inputtensor_).super_RepeatedPtrFieldBase.arena_);
  pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar12->inputtensor_).super_RepeatedPtrFieldBase,pTVar15);
LAB_0018b424:
  *(undefined4 *)((long)pvVar16 + 0x24) = 2;
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar6 = CoreML::Result::good(&local_50);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x12ce);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)bVar6;
}

Assistant:

int testInvalidRankInconsistency() {
    /*
     A -> relu1 -> B -> relu2 -> C
     rank of B when output of relu1 : 1
     rank of B when input of relu2: 2 (makes the model invalid)
     */

    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("C");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *l = nn->add_layers();
    (void)l->mutable_activation()->mutable_relu();
    l->set_name("relu1");
    l->add_input("A");
    l->add_output("B");
    l->add_outputtensor()->set_rank(1);

    auto *l2 = nn->add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu2");
    l2->add_input("B");
    l2->add_output("C");
    l2->add_inputtensor()->set_rank(2);


    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}